

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O1

bool __thiscall pcap_reader::ReadNext(pcap_reader *this)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  uint8_t *puVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int new_size;
  bool bVar9;
  
  sVar4 = fread(&this->frame_header,0x10,1,(FILE *)this->F_pcap);
  this->fragment_length = 0;
  this->ip_offset = 0;
  this->ip_version = 0;
  this->tp_length = 0;
  this->tp_offset = 0;
  *(undefined8 *)((long)&this->tp_offset + 1) = 0;
  *(undefined8 *)((long)&this->tp_port1 + 1) = 0;
  bVar9 = sVar4 == 1;
  if (bVar9) {
    uVar7 = (this->frame_header).incl_len;
    if (this->buffer_size < uVar7) {
      puVar5 = (uint8_t *)operator_new__((ulong)uVar7);
      if (this->buffer != (uint8_t *)0x0) {
        operator_delete__(this->buffer);
      }
      this->buffer = puVar5;
      this->buffer_size = uVar7;
    }
    sVar4 = fread(this->buffer,1,(ulong)(this->frame_header).incl_len,(FILE *)this->F_pcap);
    bVar9 = sVar4 == (this->frame_header).incl_len;
  }
  if (bVar9 == false) {
    return false;
  }
  uVar2 = (this->header).network;
  if (uVar2 == 0x65) {
    this->ip_offset = 0;
    uVar7 = (uint)(*this->buffer >> 4);
  }
  else {
    if (uVar2 != 1) {
      return bVar9;
    }
    puVar5 = this->buffer;
    uVar6 = *(ushort *)(puVar5 + 0xc) << 8 | *(ushort *)(puVar5 + 0xc) >> 8;
    this->ip_offset = 0xe;
    if (uVar6 == 0x86dd) {
      uVar7 = -(uint)((puVar5[0xe] & 0xf0) != 0x60) | 6;
    }
    else {
      uVar7 = 0xffffffff;
      if ((uVar6 == 0x800) && (uVar7 = 4, (puVar5[0xe] & 0xf0) != 0x40)) {
        uVar7 = 0xffffffff;
      }
    }
  }
  this->ip_version = uVar7;
  if (uVar7 == 6) {
    iVar3 = this->ip_offset;
    this->tp_offset = iVar3 + 0x28;
    this->tp_version = (uint)this->buffer[(long)iVar3 + 6];
    uVar6 = *(ushort *)(this->buffer + (long)iVar3 + 4);
    uVar7 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
  }
  else {
    if (uVar7 != 4) goto LAB_001676b4;
    puVar5 = this->buffer;
    iVar3 = this->ip_offset;
    uVar6 = *(ushort *)(puVar5 + (long)iVar3 + 2);
    bVar1 = puVar5[(long)iVar3 + 6];
    this->is_fragment = (bool)((bVar1 & 0x20) >> 5);
    uVar7 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
    uVar8 = uVar7;
    if ((bVar1 & 0x20) != 0) {
      uVar8 = (uint)puVar5[(long)iVar3 + 7] | (puVar5[(long)iVar3 + 6] & 0x1f) << 8;
    }
    this->fragment_length = uVar8;
    this->tp_offset = iVar3 + 0x14;
    this->tp_version = (uint)puVar5[(long)iVar3 + 9];
    uVar7 = uVar7 - 0x14;
  }
  this->tp_length = uVar7;
LAB_001676b4:
  if (this->tp_length != 0) {
    uVar6 = *(ushort *)(this->buffer + this->tp_offset);
    this->tp_port1 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
    uVar6 = *(ushort *)(this->buffer + (long)this->tp_offset + 2);
    this->tp_port2 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
  }
  return bVar9;
}

Assistant:

bool pcap_reader::ReadNext()
{
    size_t nb_read = fread(&frame_header, sizeof(frame_header), 1, F_pcap);
    bool ret = nb_read == 1;

    ip_version = 0;
    ip_offset = 0;
    tp_version = 0;
    tp_offset = 0;
    tp_length = 0;
    tp_port1 = 0;
    tp_port2 = 0;
    is_fragment = false;
    fragment_length = 0;

    if (ret)
    {

        if (is_wrong_endian)
        {
            /* TODO: swap the values */
        }

        if (frame_header.incl_len > buffer_size)
        {
            int new_size = frame_header.incl_len;
            uint8_t * new_buf = new uint8_t[frame_header.incl_len];
            if (new_buf == NULL)
            {
                ret = false;
            }
            else
            {
                if (buffer != NULL)
                {
                    delete[] buffer;
                }
                buffer = new_buf;
                buffer_size = new_size;
            }
        }

        if (ret)
        {
            size_t uint8_ts_read = fread(buffer, 1, frame_header.incl_len, F_pcap);
            ret = (uint8_ts_read == frame_header.incl_len);
        }
    }

    if (ret && (header.network == 1 || header.network == 101))
    {
        int ip_length;

        if (header.network == 1)
        {
            /* Ethernet */
            int payload_type = (buffer[12] << 8) | (buffer[13]);

            ip_offset = 14;
            ip_version = payload_type == 0x0800 && buffer[ip_offset] >> 4 == 4 ? 4
                : payload_type == 0x86DD && buffer[ip_offset] >> 4 == 6 ? 6
                : -1;
        }
        else
        {
            /* Raw */
            ip_offset = 0;
            ip_version = buffer[ip_offset] >> 4;
        }
        switch (ip_version)
        {
        case 4:
            /* IPv4 */
            ip_length = (buffer[ip_offset + 2] << 8) | (buffer[ip_offset + 3]);
            is_fragment = ((buffer[ip_offset + 6] & 0x20) != 0);
            fragment_length = (is_fragment) ?
                ((buffer[ip_offset + 6] & 0x1F) << 8) | (buffer[ip_offset + 7]) :
                ip_length;

            tp_offset = ip_offset + 20;
            tp_version = buffer[ip_offset + 9];
            tp_length = ip_length - (tp_offset - ip_offset);
            break;

        case 6:
            /* IPv6, 1 0 0 0 0 1 1 0 1 1 0 1 1 1 0 1 */
            tp_offset = ip_offset + 40;
            tp_version = buffer[ip_offset + 6];
            tp_length = (buffer[ip_offset + 4] << 8) | (buffer[ip_offset + 5]);
            break;
        default:
            break;
        }

        if (tp_length != 0)
        {
            tp_port1 = (buffer[tp_offset] << 8) | (buffer[tp_offset + 1]);
            tp_port2 = (buffer[tp_offset + 2] << 8) | (buffer[tp_offset + 3]);
        }
    }

    return ret;
}